

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b1filter.cc
# Opt level: O2

void ProcessFile(ostream *OutFile,istream *InFile,char *name)

{
  byte bVar1;
  char *__s;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  ostream *poVar9;
  pointer pcVar10;
  pointer pbVar11;
  pointer pbVar12;
  char *pcVar13;
  char cVar14;
  pointer pbVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  pointer pbVar19;
  ulong uStack_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source;
  value_type local_50;
  
  source.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  source.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.field_2._M_local_buf[0] = '\0';
  do {
    std::__cxx11::string::assign((char *)&local_50);
    bVar5 = false;
    bVar4 = false;
LAB_001025dd:
    while( true ) {
      do {
        do {
          bVar3 = bVar4;
          bVar2 = bVar5;
          iVar6 = std::istream::get();
          bVar5 = bVar2;
          bVar4 = bVar3;
        } while (iVar6 == 0);
      } while (iVar6 == 0xd);
      cVar14 = (char)&local_50;
      if (iVar6 != 0x22) break;
      std::__cxx11::string::push_back(cVar14);
      bVar4 = !bVar3 && !bVar2;
    }
    if (iVar6 == 0x26) {
      if ((!bVar2 && !bVar3) && Extended == 0) {
LAB_001026a7:
        std::__cxx11::string::append((char *)&local_50);
        bVar5 = false;
        bVar4 = false;
        goto LAB_001025dd;
      }
      bVar5 = false;
      bVar4 = false;
      if ((!bVar2 && !bVar3) && Extended != 0) goto LAB_001025dd;
LAB_001026b9:
      std::__cxx11::string::push_back(cVar14);
      bVar5 = bVar2;
      bVar4 = bVar3;
      goto LAB_001025dd;
    }
    if (iVar6 == 0x27) {
      std::__cxx11::string::push_back(cVar14);
      bVar5 = !bVar2 && !bVar3;
      goto LAB_001025dd;
    }
    if (iVar6 == 0x3a) {
      if (((!bVar2) && (!bVar3)) && (Extended == 0)) goto LAB_001026a7;
      goto LAB_001026b9;
    }
    if (iVar6 == -1) {
      std::__cxx11::string::~string((string *)&local_50);
      pbVar19 = source.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    }
    if (iVar6 != 10) {
      if (bVar2 || bVar3) goto LAB_001026b9;
      toupper(iVar6);
      std::__cxx11::string::push_back(cVar14);
      bVar5 = false;
      bVar4 = false;
      goto LAB_001025dd;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&source,&local_50);
  } while( true );
LAB_00102731:
  if (pbVar19 ==
      source.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar5 = true;
    pbVar12 = source.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar15 = (pointer)0x0;
    while (pbVar11 = pbVar12,
          pbVar12 = source.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, pbVar11 != pbVar19) {
      if ((!bVar5) && ((int)*(pbVar11->_M_dataplus)._M_p - 0x3aU < 0xfffffff6)) {
        std::__cxx11::string::append((char *)pbVar15);
        pbVar19 = source.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      bVar5 = false;
      pbVar15 = pbVar11;
      pbVar12 = pbVar11 + 1;
    }
    for (; pbVar12 != pbVar19; pbVar12 = pbVar12 + 1) {
      poVar9 = std::operator<<(OutFile,(string *)pbVar12);
      std::endl<char,std::char_traits<char>>(poVar9);
      pbVar19 = source.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&source);
    return;
  }
  uVar17 = 0;
LAB_0010273f:
  iVar6 = (int)uVar17;
  pcVar13 = (char *)(long)iVar6;
  if (pcVar13 < (char *)pbVar19->_M_string_length) {
    for (lVar18 = 0; lVar18 != 0x108; lVar18 = lVar18 + 8) {
      __s = *(char **)((long)reserved + lVar18);
      if (pcVar13[(long)(pbVar19->_M_dataplus)._M_p] == *__s) {
        sVar8 = strlen(__s);
        std::__cxx11::string::substr((ulong)&local_50,(ulong)pbVar19);
        bVar5 = std::operator==(&local_50,__s);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar5) {
          pcVar10 = (pbVar19->_M_dataplus)._M_p;
          if (0 < iVar6) {
            bVar1 = pcVar10[uVar17 - 1];
            iVar7 = isspace((int)(char)bVar1);
            if ((iVar7 == 0) &&
               ((0x3b < bVar1 || ((0x800ac8400000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)))) {
              std::__cxx11::string::insert((ulong)pbVar19,pcVar13);
              pcVar10 = (pbVar19->_M_dataplus)._M_p;
              uVar17 = (ulong)(iVar6 + 1);
            }
          }
          iVar7 = (int)uVar17;
          uVar16 = iVar7 + (int)sVar8;
          uVar17 = (ulong)uVar16;
          bVar1 = ((char *)(long)(int)uVar16)[(long)pcVar10];
          iVar6 = isspace((int)(char)bVar1);
          if ((iVar6 == 0) &&
             ((0x3b < bVar1 || ((0x800ac8400000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)))) {
            std::__cxx11::string::insert((ulong)pbVar19,(char *)(long)(int)uVar16);
            uVar17 = (ulong)((int)sVar8 + iVar7 + 1);
          }
          goto LAB_0010273f;
        }
      }
    }
    uVar17 = (ulong)(iVar6 + 1);
    if (pcVar13[(long)(pbVar19->_M_dataplus)._M_p] == '\"') {
      uStack_90 = 0x22;
    }
    else {
      if (pcVar13[(long)(pbVar19->_M_dataplus)._M_p] != '\'') goto LAB_0010273f;
      uStack_90 = 0x27;
    }
    iVar6 = std::__cxx11::string::find((char)pbVar19,uStack_90);
    if (iVar6 == -1) {
      std::__cxx11::string::push_back((char)pbVar19);
      goto LAB_001028e0;
    }
    uVar17 = (ulong)(iVar6 + 1);
    goto LAB_0010273f;
  }
LAB_001028e0:
  pbVar19 = pbVar19 + 1;
  goto LAB_00102731;
}

Assistant:

static void ProcessFile(
	std::ostream* OutFile,	//!< Output stream
	std::istream* InFile,	//!< Inout stream
	const char* name	//!< File name
)
{
//	std::cout << "Processing  " << name << std::endl;

	std::vector<std::string> source;

	LoadFile(InFile, source);
	MungFile(source);
	Writefile(OutFile, source);
}